

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void Timer::SetMaxDelta(int max_delta)

{
  Clock *this;
  
  if ((__uniq_ptr_impl<Clock,_std::default_delete<Clock>_>)
      clock._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
      super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
      super__Head_base<0UL,_Clock_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Clock,_std::default_delete<Clock>_>)0x0) {
    Clock::SetMaxDelta((Clock *)clock._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>
                                ._M_t.super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
                                super__Head_base<0UL,_Clock_*,_false>._M_head_impl,max_delta);
    return;
  }
  this = (Clock *)operator_new(0x10);
  Clock::Clock(this,max_delta);
  std::__uniq_ptr_impl<Clock,_std::default_delete<Clock>_>::reset
            ((__uniq_ptr_impl<Clock,_std::default_delete<Clock>_> *)&clock,this);
  return;
}

Assistant:

void Timer::SetMaxDelta(int max_delta)
{
	if (!clock)
		clock.reset(new Clock(max_delta));
	else
		clock->SetMaxDelta(max_delta);
}